

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

Length __thiscall tcmalloc::PageHeap::RoundUpSize(PageHeap *this,Length n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = -this->smallest_span_size_;
  uVar1 = (n + this->smallest_span_size_) - 1 & uVar2;
  if (uVar1 < n) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

Length PageHeap::RoundUpSize(Length n) {
  Length rounded_n = (n + smallest_span_size_ - 1) & ~(smallest_span_size_ - 1);
  if (rounded_n < n) {
    // Overflow happened. So make sure we oom by asking for biggest
    // amount possible.
    return std::numeric_limits<Length>::max() & ~(smallest_span_size_ - 1);
  }

  return rounded_n;
}